

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void build_bitfield_ins(m68k_info *info,int opcode,int has_d_arg)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  
  MCInst_setOpcode(info->inst,opcode);
  (info->extension).op_count = '\x01';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
  uVar1 = info->pc;
  uVar3 = (ulong)(uVar1 - (int)info->baseAddress & info->address_mask);
  if (info->code_len < uVar3 + 2) {
    info->pc = uVar1 + 2;
    uVar2 = 0xaaaa;
  }
  else {
    bVar5 = info->code[uVar3 + 1];
    uVar2 = (uint)CONCAT11(info->code[uVar3],bVar5);
    info->pc = uVar1 + 2;
    if ((bVar5 & 0x20) == 0) {
      bVar5 = (byte)g_5bit_data_table[bVar5 & 0x1f];
      goto LAB_00255c6c;
    }
  }
  bVar5 = (byte)uVar2 & 7;
LAB_00255c6c:
  if (has_d_arg != 0) {
    (info->extension).op_count = '\x02';
    (info->extension).operands[1].address_mode = M68K_AM_REG_DIRECT_DATA;
    (info->extension).operands[1].field_0.reg = (uVar2 >> 0xc & 7) + M68K_REG_D0;
  }
  bVar4 = 7;
  if ((uVar2 >> 0xb & 1) == 0) {
    bVar4 = 0x1f;
  }
  get_ea_mode_op(info,(info->extension).operands,info->ir,1);
  (info->extension).operands[0].mem.bitfield = '\x01';
  (info->extension).operands[0].mem.width = bVar5;
  (info->extension).operands[0].mem.offset = bVar4 & (byte)(uVar2 >> 6);
  return;
}

Assistant:

static void build_bitfield_ins(m68k_info *info, int opcode, int has_d_arg)
{
	uint8_t offset;
	uint8_t width;
	cs_m68k_op* op_ea;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 1, 0);
	uint extension = read_imm_16(info);

	op_ea = &ext->operands[0];
	op1 = &ext->operands[1];

	if (BIT_B(extension))
		offset = (extension >> 6) & 7;
	else
		offset = (extension >> 6) & 31;

	if (BIT_5(extension))
		width = extension & 7;
	else
		width = (uint8_t)g_5bit_data_table[extension & 31];

	if (has_d_arg) {
		ext->op_count = 2;
		op1->address_mode = M68K_AM_REG_DIRECT_DATA;
		op1->reg = M68K_REG_D0 + ((extension >> 12) & 7);
	}

	get_ea_mode_op(info, op_ea, info->ir, 1);

	op_ea->mem.bitfield = 1;
	op_ea->mem.width = width;
	op_ea->mem.offset = offset;
}